

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledLdLen<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  uint uVar1;
  FunctionBody *this_00;
  ThreadContext *this_01;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId;
  undefined4 *puVar4;
  Var pvVar5;
  ImplicitCallFlags IVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  byte local_42;
  ImplicitCallFlags IStack_40;
  undefined7 uStack_3f;
  LdLenInfo ldLenInfo;
  
  if (playout ==
      (OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2203,"(playout)","playout");
    if (!bVar3) goto LAB_00a64b56;
    *puVar4 = 0;
  }
  this_00 = *(FunctionBody **)(this + 0x88);
  _IStack_40 = FunctionBody::GetDynamicProfileInfo(this_00);
  pvVar5 = *(Var *)(this + (ulong)(playout->
                                  super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                  ).Instance * 8 + 0x160);
  ValidateRegValue(this,pvVar5,false,true);
  ValueType::ValueType((ValueType *)&local_44.field_0);
  local_42 = 0;
  local_44.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::Merge(&ValueType::Uninitialized,pvVar5);
  if ((char)*(ushort *)(this + 0xd4) < '\0') {
    local_42 = local_42 | 1;
    *(ushort *)(this + 0xd4) = *(ushort *)(this + 0xd4) & 0xff7f;
  }
  DynamicProfileInfo::RecordLengthLoad
            (_IStack_40,this_00,playout->profileId,(LdLenInfo *)&local_44.field_0);
  this_01 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar6 = this_01->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_01);
  propertyId = FunctionBody::GetPropertyIdFromCacheId
                         (*(FunctionBody **)(this + 0x88),
                          (playout->
                          super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
                          inlineCacheIndex);
  uVar1 = (playout->super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
          inlineCacheIndex;
  if (*(long *)(this + 0x90) == 0) {
    _IStack_40 = (DynamicProfileInfo *)CONCAT71(uStack_3f,IVar6);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar3) goto LAB_00a64b56;
    *puVar4 = 0;
    IVar6 = IStack_40;
  }
  if (*(uint *)(this + 200) <= uVar1) {
    _IStack_40 = (DynamicProfileInfo *)CONCAT71(uStack_3f,IVar6);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar3) {
LAB_00a64b56:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    IVar6 = IStack_40;
  }
  pvVar5 = ProfilingHelpers::ProfiledLdFld<false,false,false>
                     (pvVar5,propertyId,*(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar1 * 8)
                      ,(playout->super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                       ).inlineCacheIndex,*(FunctionBody **)(this + 0x88),pvVar5);
  SetReg<unsigned_int>
            (this,(playout->super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
                  Value,pvVar5);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_01);
  this_01->implicitCallFlags = this_01->implicitCallFlags | IVar6;
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledLdLen(const unaligned OpLayoutDynamicProfile<T> *const playout)
    {
        Assert(playout);
        FunctionBody * functionBody = m_functionBody;
        DynamicProfileInfo * profileData = functionBody->GetDynamicProfileInfo();

        Var instance = GetReg(playout->Instance);

        LdLenInfo ldLenInfo;
        ldLenInfo.arrayType = ValueType::Uninitialized.Merge(instance);

        if (this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization))
        {
            ldLenInfo.disableAggressiveSpecialization = true;
            this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);
        }

        profileData->RecordLengthLoad(functionBody, playout->profileId, ldLenInfo);

        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Var value = ProfilingHelpers::ProfiledLdFld<false, false, false>(
            instance,
            propertyId,
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            GetFunctionBody(),
            instance);

        SetReg(playout->Value, value);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }